

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O0

RBBINode * __thiscall icu_63::RBBIRuleScanner::pushNewNode(RBBIRuleScanner *this,NodeType t)

{
  UBool UVar1;
  RBBINode *this_00;
  undefined4 in_register_00000034;
  size_t size;
  RBBINode *local_50;
  NodeType t_local;
  RBBIRuleScanner *this_local;
  
  size = CONCAT44(in_register_00000034,t);
  UVar1 = ::U_FAILURE(*this->fRB->fStatus);
  if (UVar1 == '\0') {
    if (this->fNodeStackPtr < 99) {
      this->fNodeStackPtr = this->fNodeStackPtr + 1;
      this_00 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,size);
      local_50 = (RBBINode *)0x0;
      if (this_00 != (RBBINode *)0x0) {
        RBBINode::RBBINode(this_00,t);
        local_50 = this_00;
      }
      this->fNodeStack[this->fNodeStackPtr] = local_50;
      if (this->fNodeStack[this->fNodeStackPtr] == (RBBINode *)0x0) {
        *this->fRB->fStatus = U_MEMORY_ALLOCATION_ERROR;
      }
      this_local = (RBBIRuleScanner *)this->fNodeStack[this->fNodeStackPtr];
    }
    else {
      error(this,U_BRK_RULE_SYNTAX);
      this_local = (RBBIRuleScanner *)0x0;
    }
  }
  else {
    this_local = (RBBIRuleScanner *)0x0;
  }
  return (RBBINode *)this_local;
}

Assistant:

RBBINode  *RBBIRuleScanner::pushNewNode(RBBINode::NodeType  t) {
    if (U_FAILURE(*fRB->fStatus)) {
        return NULL;
    }
    if (fNodeStackPtr >= kStackSize - 1) {
        error(U_BRK_RULE_SYNTAX);
        RBBIDebugPuts("RBBIRuleScanner::pushNewNode - stack overflow.");
        return NULL;
    }
    fNodeStackPtr++;
    fNodeStack[fNodeStackPtr] = new RBBINode(t);
    if (fNodeStack[fNodeStackPtr] == NULL) {
        *fRB->fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    return fNodeStack[fNodeStackPtr];
}